

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.h
# Opt level: O0

bitmask<slang::ast::InstanceFlags> slang::ast::operator~(InstanceFlags op)

{
  undefined1 in_AL;
  bitmask<slang::ast::InstanceFlags> bVar1;
  undefined7 in_register_00000001;
  InstanceFlags in_DIL;
  bitmask<slang::ast::InstanceFlags> *this;
  
  this = (bitmask<slang::ast::InstanceFlags> *)
         CONCAT17((char)((uint7)in_register_00000001 >> 0x30),
                  CONCAT16(in_DIL,(int6)CONCAT71(in_register_00000001,in_AL)));
  bitmask<slang::ast::InstanceFlags>::bitmask
            ((bitmask<slang::ast::InstanceFlags> *)&stack0xfffffffffffffffd,in_DIL);
  bVar1 = bitmask<slang::ast::InstanceFlags>::operator~(this);
  return (bitmask<slang::ast::InstanceFlags>)bVar1.m_bits;
}

Assistant:

class SLANG_EXPORT InstanceSymbolBase : public Symbol {
public:
    /// The path to this instance, if it is contained within an array (or multiple
    /// nested arrays). This is a list of indices that can be used to index into the
    /// arrays' elements list, always zero based. This is not necessarily what the
    /// user wrote in the source code; the array dimensions are needed to translate
    /// from this canonical space back to the source code indices.
    std::span<const uint32_t> arrayPath;

    /// If this instance is part of an array, walk upward to find the array's name.
    /// Otherwise returns the name of the instance itself.
    std::string_view getArrayName() const;

    /// Gets the set of dimensions describing the instance array that contains this instance.
    /// If this instance is not part of an array, does not add any dimensions to the given list.
    void getArrayDimensions(SmallVectorBase<ConstantRange>& dimensions) const;

    static bool isKind(SymbolKind kind) {
        return kind == SymbolKind::Instance || kind == SymbolKind::PrimitiveInstance ||
               kind == SymbolKind::CheckerInstance;
    }

protected:
    using Symbol::Symbol;
}